

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
          (SmallVectorBase<slang::ast::Expression_const*> *this,Expression **args)

{
  iterator ppEVar1;
  Expression **args_local;
  SmallVectorBase<const_slang::ast::Expression_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppEVar1 = SmallVectorBase<const_slang::ast::Expression_*>::end
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)this);
    this_local = (SmallVectorBase<const_slang::ast::Expression_*> *)
                 emplaceRealloc<slang::ast::Expression_const*>(this,ppEVar1,args);
  }
  else {
    ppEVar1 = SmallVectorBase<const_slang::ast::Expression_*>::end
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)this);
    *ppEVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<const_slang::ast::Expression_*> *)
                 SmallVectorBase<const_slang::ast::Expression_*>::back
                           ((SmallVectorBase<const_slang::ast::Expression_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }